

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

bool tinyusdz::value::IsLerpSupportedType(uint32_t tyid)

{
  uint32_t uVar1;
  value_type *tyname;
  uint32_t in_EDX;
  byte bVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pv;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  TryGetUnderlyingTypeName_abi_cxx11_(&local_48,(value *)(ulong)tyid,in_EDX);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_70,&local_48);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_48);
  uVar1 = 0;
  if (local_70.has_value_ == true) {
    tyname = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&local_70);
    uVar1 = GetTypeId(tyname);
  }
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_70);
  bVar2 = 1;
  if (tyid == 0xe) goto LAB_0021d622;
  if ((tyid >> 0x14 & 1) == 0) {
    if ((((tyid & 0xffeffffe) == 0x28) ||
        (((tyid - 0x11 < 0x1d && ((0x1e000007U >> (tyid - 0x11 & 0x1f) & 1) != 0)) ||
         (tyid == 0x30 || (tyid & 0xffeffffe) == 0x2e)))) ||
       (((tyid < 0x37 && ((0x46000000000000U >> ((ulong)tyid & 0x3f) & 1) != 0)) ||
        (bVar2 = tyid - 0x37 < 2, local_70.has_value_ != true || (bool)bVar2)))) goto LAB_0021d622;
LAB_0021d6d0:
    bVar2 = 1;
    if (uVar1 == 0xe) goto LAB_0021d622;
    if ((uVar1 >> 0x14 & 1) == 0) {
      if (uVar1 < 0x39) {
        bVar2 = (byte)(0x1c7ff00000e0000 >> ((byte)uVar1 & 0x3f));
        goto LAB_0021d622;
      }
    }
    else if (uVar1 - 0x10000e < 0x2b) {
      bVar2 = (byte)(0x71ffc000039 >> ((byte)(uVar1 - 0x10000e) & 0x3f));
      goto LAB_0021d622;
    }
  }
  else {
    if (tyid - 0x10000e < 0x2b) {
      bVar2 = (byte)(0x71ffc000039 >> ((byte)(tyid - 0x10000e) & 0x3f));
      if (((~local_70.has_value_ | bVar2) & 1) != 0) goto LAB_0021d622;
      goto LAB_0021d6d0;
    }
    if (local_70.has_value_ != false) goto LAB_0021d6d0;
  }
  bVar2 = 0;
LAB_0021d622:
  return (bool)(bVar2 & 1);
}

Assistant:

bool IsLerpSupportedType(uint32_t tyid) {

  // TODO: Directly get underlying_typeid
  bool has_underlying_tyid{false};
  uint32_t underlying_tyid{TYPE_ID_INVALID};

  if (auto pv = TryGetUnderlyingTypeName(tyid)) {
    underlying_tyid = GetTypeId(pv.value());
    has_underlying_tyid = true;
  } 

  // See also for underlying_type_id to simplify check for Role types(e.g. color3f)
#define IS_SUPPORTED_TYPE(__tyid, __ty) \
  if (__tyid == value::TypeTraits<__ty>::type_id()) { \
    return true; \
  } else if (__tyid == value::TypeTraits<__ty>::underlying_type_id()) { \
    return true; \
  } else if (__tyid & value::TYPE_ID_1D_ARRAY_BIT) { \
    if ((__tyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__ty>::type_id())) { \
      return true; \
    } else if ((__tyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__ty>::underlying_type_id())) { \
      return true; \
    } \
  }

  // Assume __uty is underlying_type.
#define IS_SUPPORTED_UNDERLYING_TYPE(__utyid, __uty) \
  if (__utyid == value::TypeTraits<__uty>::type_id()) { \
    return true; \
  } else if (__utyid & value::TYPE_ID_1D_ARRAY_BIT) { \
    if ((__utyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__uty>::type_id())) { \
      return true; \
    } \
  }

  IS_SUPPORTED_TYPE(tyid, value::half)
  IS_SUPPORTED_TYPE(tyid, value::half2)
  IS_SUPPORTED_TYPE(tyid, value::half3)
  IS_SUPPORTED_TYPE(tyid, value::half4)
  IS_SUPPORTED_TYPE(tyid, float)
  IS_SUPPORTED_TYPE(tyid, value::float2)
  IS_SUPPORTED_TYPE(tyid, value::float3)
  IS_SUPPORTED_TYPE(tyid, value::float4)
  IS_SUPPORTED_TYPE(tyid, double)
  IS_SUPPORTED_TYPE(tyid, value::double2)
  IS_SUPPORTED_TYPE(tyid, value::double3)
  IS_SUPPORTED_TYPE(tyid, value::double4)
  IS_SUPPORTED_TYPE(tyid, value::quath)
  IS_SUPPORTED_TYPE(tyid, value::quatf)
  IS_SUPPORTED_TYPE(tyid, value::quatd)
  IS_SUPPORTED_TYPE(tyid, value::matrix2d)
  IS_SUPPORTED_TYPE(tyid, value::matrix3d)
  IS_SUPPORTED_TYPE(tyid, value::matrix4d)

  if (has_underlying_tyid) {
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, float)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, double)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quath)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quatf)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quatd)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix2d)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix3d)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix4d)
  }

#undef IS_SUPPORTED_TYPE
#undef IS_SUPPORTED_UNDERLYING_TYPE

  return false;

}